

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qminimalbackingstore.cpp
# Opt level: O0

void __thiscall
QMinimalBackingStore::QMinimalBackingStore(QMinimalBackingStore *this,QWindow *window)

{
  uint uVar1;
  QMinimalIntegration *this_00;
  QWindow *in_RSI;
  QPlatformBackingStore *in_RDI;
  long in_FS_OFFSET;
  QPlatformBackingStore *file;
  QMessageLogger *in_stack_ffffffffffffffd0;
  QDebug *in_stack_ffffffffffffffd8;
  QDebug local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  file = in_RDI;
  QPlatformBackingStore::QPlatformBackingStore(in_RDI,in_RSI);
  *(undefined ***)in_RDI = &PTR__QMinimalBackingStore_0010c7b8;
  QImage::QImage((QImage *)(in_RDI + 0x10));
  this_00 = QMinimalIntegration::instance();
  uVar1 = QMinimalIntegration::options(this_00);
  in_RDI[0x28] = (QPlatformBackingStore)((uVar1 & 1) != 0);
  if (((byte)in_RDI[0x28] & 1) != 0) {
    QMessageLogger::QMessageLogger
              (in_stack_ffffffffffffffd0,(char *)file,(int)((ulong)in_RSI >> 0x20),(char *)in_RDI);
    QMessageLogger::debug();
    QDebug::operator<<(in_stack_ffffffffffffffd8,(char *)window);
    QDebug::operator<<((QDebug *)in_RSI,(quint64)in_RDI);
    QDebug::~QDebug(local_10);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QMinimalBackingStore::QMinimalBackingStore(QWindow *window)
    : QPlatformBackingStore(window)
    , mDebug(QMinimalIntegration::instance()->options() & QMinimalIntegration::DebugBackingStore)
{
    if (mDebug)
        qDebug() << "QMinimalBackingStore::QMinimalBackingStore:" << (quintptr)this;
}